

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void __thiscall
cubeb_resampler_passthrough_output_only_Test::TestBody
          (cubeb_resampler_passthrough_output_only_Test *this)

{
  cubeb_resampler *resampler;
  char *message;
  int iVar1;
  bool bVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_878;
  AssertionResult gtest_ar;
  long got;
  AssertHelper local_858;
  cubeb_stream_params output_params;
  float output_buffer [512];
  
  output_params.channels = 2;
  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.rate = 0xac44;
  resampler = cubeb_resampler_create
                        ((cubeb_stream *)0x0,(cubeb_stream_params *)0x0,&output_params,0xac44,
                         cb_passthrough_resampler_output,(void *)0x0,CUBEB_RESAMPLER_QUALITY_VOIP,
                         CUBEB_RESAMPLER_RECLOCK_NONE);
  iVar1 = 0x1e;
  while( true ) {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) {
      cubeb_resampler_destroy(resampler);
      return;
    }
    got = cubeb_resampler_fill(resampler,(void *)0x0,(long *)0x0,output_buffer,0x100);
    local_878.ptr_._0_4_ = 0x100;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar,"got","256",&got,(int *)&local_878);
    if (gtest_ar.success_ == false) break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  testing::Message::Message((Message *)&local_878);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_858,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
             ,0x249,message);
  testing::internal::AssertHelper::operator=(&local_858,(Message *)&local_878);
  testing::internal::AssertHelper::~AssertHelper(&local_858);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_878);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_output_only)
{
  // Test that the passthrough resampler works when there is only an output stream.
  cubeb_stream_params output_params;

  const size_t output_channels = 2;
  output_params.channels = output_channels;
  output_params.rate = 44100;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  int target_rate = output_params.rate;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, nullptr, &output_params,
                           target_rate, cb_passthrough_resampler_output, nullptr,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  float output_buffer[output_channels * 256];

  long got;
  for (uint32_t i = 0; i < 30; i++) {
    got = cubeb_resampler_fill(resampler, nullptr, nullptr, output_buffer, 256);
    ASSERT_EQ(got, 256);
  }

  cubeb_resampler_destroy(resampler);
}